

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Mode __thiscall
Catch::Clara::Parser::handlePositional
          (Parser *this,size_t i,char c,string *arg,
          vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens)

{
  Mode MVar1;
  long lVar2;
  bool bVar3;
  string data;
  undefined1 local_98 [8];
  _Alloc_hider local_90;
  char local_80 [16];
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  undefined4 *local_50;
  undefined8 local_48;
  undefined4 local_40 [4];
  
  bVar3 = true;
  if (this->inQuotes == false) {
    local_50 = local_40;
    local_40[0] = 0x920;
    local_48 = 3;
    lVar2 = std::__cxx11::string::find((char)&local_50,(ulong)(uint)(int)c);
    bVar3 = lVar2 == -1;
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
  }
  if (bVar3) {
    MVar1 = this->mode;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_70,(ulong)arg);
    local_98._0_4_ = Positional;
    local_90._M_p = local_80;
    std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_70,local_70 + local_68);
    std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
    emplace_back<Catch::Clara::Parser::Token>(tokens,(Token *)local_98);
    if (local_90._M_p != local_80) {
      operator_delete(local_90._M_p);
    }
    if (local_70 != local_60) {
      operator_delete(local_70);
    }
    MVar1 = None;
  }
  return MVar1;
}

Assistant:

Mode handlePositional( std::size_t i, char c, std::string const& arg, std::vector<Token>& tokens ) {
            if( inQuotes || std::string( " \t\0", 3 ).find( c ) == std::string::npos )
                return mode;

            std::string data = arg.substr( from, i-from );
            tokens.push_back( Token( Token::Positional, data ) );
            return None;
        }